

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_comp(ASMState *as,IRIns *ir)

{
  undefined1 uVar1;
  byte bVar2;
  IRIns IVar3;
  int iVar4;
  Reg RVar5;
  Reg rb;
  ushort *puVar6;
  long lVar7;
  x86Op xo_00;
  bool bVar8;
  bool bVar9;
  Reg right_2;
  Reg left_3;
  x86Op xo;
  IRType1 origt_1;
  Reg left_2;
  IRType1 origt;
  IRIns *irll;
  RegSet allow;
  Reg left_1;
  Reg right_1;
  int usetest;
  IRIns *irl;
  int32_t imm;
  Reg r64;
  IROp leftop;
  IRRef rref_1;
  IRRef lref_1;
  IRRef tmp;
  MCLabel l_around;
  Reg local_28;
  Reg right;
  Reg left;
  IRRef rref;
  IRRef lref;
  uint32_t cc;
  IRIns *ir_local;
  ASMState *as_local;
  
  rref = (IRRef)asm_compmap[(ir->field_1).o];
  _lref = ir;
  ir_local = (IRIns *)as;
  if (((ir->field_1).t.irt & 0x1f) == 0xe) {
    left = (Reg)(ir->field_0).op1;
    right = (uint)(ir->field_0).op2;
    if ((asm_compmap[(ir->field_1).o] & 0x4000) != 0) {
      rref = rref ^ 0x6050;
      rref_1 = left;
      right = left;
      left = (uint)(ir->field_0).op2;
    }
    local_28 = ra_alloc1(as,left,0xffff0000);
    _lref_1 = ir_local[0x10];
    asm_guardcc((ASMState *)&ir_local->field_0,rref >> 4);
    if ((rref & 0x2000) != 0) {
      if ((rref & 0x1000) == 0) {
        asm_guardcc((ASMState *)&ir_local->field_0,10);
      }
      else if (_lref_1 == ir_local[0x28]) {
        *(undefined4 *)((long)ir_local + 0xbc) = 2;
        if (ir_local[0x2a] == (IRIns)0x0) {
          emit_jcc((ASMState *)&ir_local->field_0,10,(MCode *)ir_local[0x10]);
        }
        else {
          emit_sjcc((ASMState *)&ir_local->field_0,10,(MCLabel)ir_local[0x10]);
        }
      }
      else {
        emit_sjcc((ASMState *)&ir_local->field_0,10,(MCLabel)_lref_1);
      }
    }
    l_around._4_4_ =
         asm_fuseload((ASMState *)&ir_local->field_0,right,
                      (1 << ((byte)local_28 & 0x1f) ^ 0xffffffffU) & 0xffff0000);
    emit_mrm((ASMState *)&ir_local->field_0,XO_UCOMISD,local_28,l_around._4_4_);
    return;
  }
  leftop = (IROp)(ir->field_0).op1;
  r64 = (Reg)(ir->field_0).op2;
  imm = (int32_t)*(byte *)((long)as->ir + (ulong)leftop * 8 + 5);
  irl._4_4_ = 0;
  if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
    irl._4_4_ = 0x80200;
  }
  irl._0_4_ = 0;
  if ((leftop < 0x8000) ||
     ((0x7fff < r64 &&
      (((((imm == 0x42 || (imm == 0x43)) || (imm == 0x44)) || ((imm == 0x45 || (imm == 0x46)))) ||
       ((imm == 0x47 || (imm == 0x48)))))))) {
    if ((rref & 0xc) == 0xc) {
      rref = rref ^ 0x53;
    }
    else if ((rref & 10) == 2) {
      rref = rref ^ 0x55;
    }
    leftop = (IROp)(ir->field_0).op2;
    r64 = (Reg)(ir->field_0).op1;
  }
  iVar4 = asm_isk32(as,r64,(int32_t *)&irl);
  if (iVar4 == 0) {
    RVar5 = ra_alloc1((ASMState *)&ir_local->field_0,leftop,0xbfef);
    rb = asm_fuseloadm((ASMState *)&ir_local->field_0,r64,
                       (1 << ((byte)RVar5 & 0x1f) ^ 0xffffffffU) & 0xbfef,irl._4_4_);
    asm_guardcc((ASMState *)&ir_local->field_0,rref);
    emit_mrm((ASMState *)&ir_local->field_0,XO_CMP,irl._4_4_ + RVar5,rb);
    return;
  }
  puVar6 = (ushort *)((long)ir_local[0x12] + (ulong)leftop * 8);
  bVar8 = (uint)irl != 0;
  bVar9 = (rref & 10) == 2;
  if (((bVar8 || bVar9) || (*(char *)((long)puVar6 + 5) != '!')) ||
     (((IRIns *)(puVar6 + 4) != _lref ||
      (((puVar6[3] & 0x80) == 0 || (*(char *)((long)puVar6 + 7) != '\0')))))) {
    if ((((*(char *)((long)puVar6 + 5) == 'B') ||
         ((((*(char *)((long)puVar6 + 5) == 'C' || (*(char *)((long)puVar6 + 5) == 'D')) ||
           (*(char *)((long)puVar6 + 5) == 'E')) ||
          ((*(char *)((long)puVar6 + 5) == 'F' || (*(char *)((long)puVar6 + 5) == 'G')))))) ||
        (*(char *)((long)puVar6 + 5) == 'H')) &&
       (((((puVar6[2] & 0x1f) == 0x10 && ((uint)irl == ((uint)irl & 0xff))) ||
         ((((puVar6[2] & 0x1f) == 0xf || ((puVar6[2] & 0x1f) == 0x11)) &&
          ((uint)irl == (int)(char)(uint)irl)))) ||
        ((((puVar6[2] & 0x1f) == 0x12 && ((uint)irl == ((uint)irl & 0xffff))) &&
         ((int)(short)(uint)irl == (int)(char)(uint)irl)))))) {
      bVar2 = (byte)puVar6[2];
      *(byte *)(puVar6 + 2) = (byte)puVar6[2] & 0xe0 | 0x13;
      xo = asm_fuseload((ASMState *)&ir_local->field_0,leftop,0xbfef);
      *(byte *)(puVar6 + 2) = bVar2;
      if (xo == 0x20) {
        if (((puVar6[2] & 0x1f) == 0x10) || ((puVar6[2] & 0x1f) == 0x12)) {
          rref = rref >> 4;
        }
        asm_guardcc((ASMState *)&ir_local->field_0,rref);
        IVar3 = ir_local[0x10];
        ir_local[0x10] = (IRIns)(IVar3.field_0 + -1);
        *(char *)((long)IVar3 + -1) = (char)(uint)irl;
        xo_00 = XO_ARITHiw8;
        if ((bVar2 & 0x1f) == 0xf || (bVar2 & 0x1f) == 0x10) {
          xo_00 = XO_ARITHib;
        }
        emit_mrm((ASMState *)&ir_local->field_0,xo_00,irl._4_4_ + 7,0x20);
        return;
      }
    }
    else {
      xo = asm_fuseloadm((ASMState *)&ir_local->field_0,leftop,0xbfef,irl._4_4_);
    }
    asm_guardcc((ASMState *)&ir_local->field_0,rref);
    if ((!bVar8 && !bVar9) && (xo != 0x20)) {
      right_2 = 0x850000fe;
      if ((((_lref->field_1).t.irt & 0x1f) == 0x10) &&
         (right_2 = 0x840000fe, (0xfU >> ((byte)xo & 0x1f) & 1) == 0)) {
        xo = xo | 0x200;
      }
      emit_rr((ASMState *)&ir_local->field_0,right_2,irl._4_4_ + xo,xo);
      if ((IRIns *)(puVar6 + 4) != _lref) {
        return;
      }
      ir_local[0x29] = ir_local[0x10];
      return;
    }
    emit_gmrmi((ASMState *)&ir_local->field_0,0x838107,irl._4_4_ + xo,(uint)irl);
    return;
  }
  irll._4_4_ = 0x80;
  irll._0_4_ = 0xbfef;
  iVar4 = asm_isk32((ASMState *)&ir_local->field_0,(uint)puVar6[1],(int32_t *)&irl);
  if (iVar4 == 0) {
    irll._4_4_ = ra_alloc1((ASMState *)&ir_local->field_0,(uint)puVar6[1],0xbfef);
    irll._0_4_ = (1 << ((byte)irll._4_4_ & 0x1f) ^ 0xffffffffU) & 0xbfef;
  }
  else {
    lVar7 = (long)ir_local[0x12] + (ulong)*puVar6 * 8;
    if ((((((*(char *)(lVar7 + 5) == 'B') || (*(char *)(lVar7 + 5) == 'C')) ||
          (*(char *)(lVar7 + 5) == 'D')) ||
         ((*(char *)(lVar7 + 5) == 'E' || (*(char *)(lVar7 + 5) == 'F')))) ||
        ((*(char *)(lVar7 + 5) == 'G' || (*(char *)(lVar7 + 5) == 'H')))) &&
       (((*(byte *)(lVar7 + 4) & 0x1f) == 0xf || ((*(byte *)(lVar7 + 4) & 0x1f) == 0x10)))) {
      uVar1 = *(undefined1 *)(lVar7 + 4);
      *(byte *)(lVar7 + 4) = *(byte *)(lVar7 + 4) & 0xe0 | 0x13;
      ir_local[0x19].field_1.op12 = ir_local[0x19].field_1.op12 - 1;
      allow = asm_fuseload((ASMState *)&ir_local->field_0,(uint)*puVar6,0xbfef);
      ir_local[0x19].field_1.op12 = ir_local[0x19].field_1.op12 + 1;
      *(undefined1 *)(lVar7 + 4) = uVar1;
      if (allow == 0x20) {
        asm_guardcc((ASMState *)&ir_local->field_0,rref);
        IVar3 = ir_local[0x10];
        ir_local[0x10] = (IRIns)(IVar3.field_0 + -1);
        *(char *)((long)IVar3 + -1) = (char)(uint)irl;
        emit_mrm((ASMState *)&ir_local->field_0,XO_GROUP3b,0,0x20);
        return;
      }
      goto LAB_001749c7;
    }
  }
  ir_local[0x19].field_1.op12 = ir_local[0x19].field_1.op12 - 1;
  allow = asm_fuseloadm((ASMState *)&ir_local->field_0,(uint)*puVar6,(uint)irll,irl._4_4_);
  ir_local[0x19].field_1.op12 = ir_local[0x19].field_1.op12 + 1;
LAB_001749c7:
  asm_guardcc((ASMState *)&ir_local->field_0,rref);
  if ((irll._4_4_ & 0x80) == 0) {
    emit_mrm((ASMState *)&ir_local->field_0,XO_TEST,irl._4_4_ + irll._4_4_,allow);
  }
  else {
    *(uint *)((long)ir_local[0x10] + -4) = (uint)irl;
    ir_local[0x10] = (IRIns)(ir_local[0x10] + -4);
    emit_mrm((ASMState *)&ir_local->field_0,XO_GROUP3,irl._4_4_,allow);
  }
  return;
}

Assistant:

static void asm_comp(ASMState *as, IRIns *ir)
{
  uint32_t cc = asm_compmap[ir->o];
  if (irt_isnum(ir->t)) {
    IRRef lref = ir->op1;
    IRRef rref = ir->op2;
    Reg left, right;
    MCLabel l_around;
    /*
    ** An extra CC_P branch is required to preserve ordered/unordered
    ** semantics for FP comparisons. This can be avoided by swapping
    ** the operands and inverting the condition (except for EQ and UNE).
    ** So always try to swap if possible.
    **
    ** Another option would be to swap operands to achieve better memory
    ** operand fusion. But it's unlikely that this outweighs the cost
    ** of the extra branches.
    */
    if (cc & VCC_S) {  /* Swap? */
      IRRef tmp = lref; lref = rref; rref = tmp;
      cc ^= (VCC_PS|(5<<4));  /* A <-> B, AE <-> BE, PS <-> none */
    }
    left = ra_alloc1(as, lref, RSET_FPR);
    l_around = emit_label(as);
    asm_guardcc(as, cc >> 4);
    if (cc & VCC_P) {  /* Extra CC_P branch required? */
      if (!(cc & VCC_U)) {
	asm_guardcc(as, CC_P);  /* Branch to exit for ordered comparisons. */
      } else if (l_around != as->invmcp) {
	emit_sjcc(as, CC_P, l_around);  /* Branch around for unordered. */
      } else {
	/* Patched to mcloop by asm_loop_fixup. */
	as->loopinv = 2;
	if (as->realign)
	  emit_sjcc(as, CC_P, as->mcp);
	else
	  emit_jcc(as, CC_P, as->mcp);
      }
    }
    right = asm_fuseload(as, rref, rset_exclude(RSET_FPR, left));
    emit_mrm(as, XO_UCOMISD, left, right);
  } else {
    IRRef lref = ir->op1, rref = ir->op2;
    IROp leftop = (IROp)(IR(lref)->o);
    Reg r64 = REX_64IR(ir, 0);
    int32_t imm = 0;
    lj_assertA(irt_is64(ir->t) || irt_isint(ir->t) ||
	       irt_isu32(ir->t) || irt_isaddr(ir->t) || irt_isu8(ir->t),
	       "bad comparison data type %d", irt_type(ir->t));
    /* Swap constants (only for ABC) and fusable loads to the right. */
    if (irref_isk(lref) || (!irref_isk(rref) && opisfusableload(leftop))) {
      if ((cc & 0xc) == 0xc) cc ^= 0x53;  /* L <-> G, LE <-> GE */
      else if ((cc & 0xa) == 0x2) cc ^= 0x55;  /* A <-> B, AE <-> BE */
      lref = ir->op2; rref = ir->op1;
    }
    if (asm_isk32(as, rref, &imm)) {
      IRIns *irl = IR(lref);
      /* Check wether we can use test ins. Not for unsigned, since CF=0. */
      int usetest = (imm == 0 && (cc & 0xa) != 0x2);
      if (usetest && irl->o == IR_BAND && irl+1 == ir && !ra_used(irl)) {
	/* Combine comp(BAND(ref, r/imm), 0) into test mrm, r/imm. */
	Reg right, left = RID_NONE;
	RegSet allow = RSET_GPR;
	if (!asm_isk32(as, irl->op2, &imm)) {
	  left = ra_alloc1(as, irl->op2, allow);
	  rset_clear(allow, left);
	} else {  /* Try to Fuse IRT_I8/IRT_U8 loads, too. See below. */
	  IRIns *irll = IR(irl->op1);
	  if (opisfusableload((IROp)irll->o) &&
	      (irt_isi8(irll->t) || irt_isu8(irll->t))) {
	    IRType1 origt = irll->t;  /* Temporarily flip types. */
	    irll->t.irt = (irll->t.irt & ~IRT_TYPE) | IRT_INT;
	    as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	    right = asm_fuseload(as, irl->op1, RSET_GPR);
	    as->curins++;
	    irll->t = origt;
	    if (right != RID_MRM) goto test_nofuse;
	    /* Fusion succeeded, emit test byte mrm, imm8. */
	    asm_guardcc(as, cc);
	    emit_i8(as, (imm & 0xff));
	    emit_mrm(as, XO_GROUP3b, XOg_TEST, RID_MRM);
	    return;
	  }
	}
	as->curins--;  /* Skip to BAND to avoid failing in noconflict(). */
	right = asm_fuseloadm(as, irl->op1, allow, r64);
	as->curins++;  /* Undo the above. */
      test_nofuse:
	asm_guardcc(as, cc);
	if (ra_noreg(left)) {
	  emit_i32(as, imm);
	  emit_mrm(as, XO_GROUP3, r64 + XOg_TEST, right);
	} else {
	  emit_mrm(as, XO_TEST, r64 + left, right);
	}
      } else {
	Reg left;
	if (opisfusableload((IROp)irl->o) &&
	    ((irt_isu8(irl->t) && checku8(imm)) ||
	     ((irt_isi8(irl->t) || irt_isi16(irl->t)) && checki8(imm)) ||
	     (irt_isu16(irl->t) && checku16(imm) && checki8((int16_t)imm)))) {
	  /* Only the IRT_INT case is fused by asm_fuseload.
	  ** The IRT_I8/IRT_U8 loads and some IRT_I16/IRT_U16 loads
	  ** are handled here.
	  ** Note that cmp word [mem], imm16 should not be generated,
	  ** since it has a length-changing prefix. Compares of a word
	  ** against a sign-extended imm8 are ok, however.
	  */
	  IRType1 origt = irl->t;  /* Temporarily flip types. */
	  irl->t.irt = (irl->t.irt & ~IRT_TYPE) | IRT_INT;
	  left = asm_fuseload(as, lref, RSET_GPR);
	  irl->t = origt;
	  if (left == RID_MRM) {  /* Fusion succeeded? */
	    if (irt_isu8(irl->t) || irt_isu16(irl->t))
	      cc >>= 4;  /* Need unsigned compare. */
	    asm_guardcc(as, cc);
	    emit_i8(as, imm);
	    emit_mrm(as, (irt_isi8(origt) || irt_isu8(origt)) ?
			 XO_ARITHib : XO_ARITHiw8, r64 + XOg_CMP, RID_MRM);
	    return;
	  }  /* Otherwise handle register case as usual. */
	} else {
	  left = asm_fuseloadm(as, lref,
			       irt_isu8(ir->t) ? RSET_GPR8 : RSET_GPR, r64);
	}
	asm_guardcc(as, cc);
	if (usetest && left != RID_MRM) {
	  /* Use test r,r instead of cmp r,0. */
	  x86Op xo = XO_TEST;
	  if (irt_isu8(ir->t)) {
	    lj_assertA(ir->o == IR_EQ || ir->o == IR_NE, "bad usage");
	    xo = XO_TESTb;
	    if (!rset_test(RSET_RANGE(RID_EAX, RID_EBX+1), left)) {
	      if (LJ_64) {
		left |= FORCE_REX;
	      } else {
		emit_i32(as, 0xff);
		emit_mrm(as, XO_GROUP3, XOg_TEST, left);
		return;
	      }
	    }
	  }
	  emit_rr(as, xo, r64 + left, left);
	  if (irl+1 == ir)  /* Referencing previous ins? */
	    as->flagmcp = as->mcp;  /* Set flag to drop test r,r if possible. */
	} else {
	  emit_gmrmi(as, XG_ARITHi(XOg_CMP), r64 + left, imm);
	}
      }
    } else {
      Reg left = ra_alloc1(as, lref, RSET_GPR);
      Reg right = asm_fuseloadm(as, rref, rset_exclude(RSET_GPR, left), r64);
      asm_guardcc(as, cc);
      emit_mrm(as, XO_CMP, r64 + left, right);
    }
  }
}